

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZRefPatternTools.cpp
# Opt level: O2

TPZAutoPointer<TPZRefPattern> __thiscall
TPZRefPatternTools::PerfectMatchRefPattern
          (TPZRefPatternTools *this,TPZGeoEl *gel,TPZVec<int> *sidestorefine)

{
  _List_node_base **pp_Var1;
  TPZRefPattern *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TPZGeoEl *pTVar6;
  long lVar7;
  _List_node_base *p_Var8;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> *this_01;
  TPZAutoPointer<TPZRefPattern> refpat;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> patlist;
  list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_> perfectmatch;
  
  if (gel == (TPZGeoEl *)0x0) {
    TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
              ((TPZAutoPointer<TPZRefPattern> *)this,(TPZRefPattern *)0x0);
  }
  else {
    p_Var8 = (_List_node_base *)&patlist;
    patlist.
    super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
    ._M_impl._M_node._M_size = 0;
    perfectmatch.
    super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&perfectmatch;
    perfectmatch.
    super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
    ._M_impl._M_node._M_size = 0;
    patlist.
    super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = p_Var8;
    patlist.
    super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = p_Var8;
    perfectmatch.
    super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         perfectmatch.
         super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    GetCompatibleRefPatterns
              (gel,(list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                    *)p_Var8);
    while (p_Var8 = (((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                       *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)&patlist) {
      if ((p_Var8[1]._M_next != (_List_node_base *)0x0) &&
         (this_00 = (TPZRefPattern *)(p_Var8[1]._M_next)->_M_next, this_00 != (TPZRefPattern *)0x0))
      {
        pTVar6 = TPZRefPattern::Element(this_00,0);
        iVar2 = (**(code **)(*(long *)pTVar6 + 0x98))(pTVar6);
        iVar3 = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
        iVar4 = (**(code **)(*(long *)pTVar6 + 0x210))(pTVar6);
        iVar3 = iVar3 - (uint)(iVar4 == 3);
        lVar7 = (long)iVar2;
        iVar4 = iVar3;
        if (iVar3 < iVar2) {
          iVar4 = iVar2;
        }
        do {
          if (iVar3 <= lVar7) goto LAB_00f90936;
          iVar2 = sidestorefine->fStore[lVar7];
          iVar5 = TPZRefPattern::NSideNodes
                            ((TPZRefPattern *)(p_Var8[1]._M_next)->_M_next,(int)lVar7);
          lVar7 = lVar7 + 1;
        } while (iVar2 == iVar5);
        iVar4 = (int)lVar7 + -1;
LAB_00f90936:
        if (iVar4 == iVar3) {
          std::__cxx11::
          list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
          push_back(&perfectmatch,(value_type *)(p_Var8 + 1));
        }
      }
    }
    std::__cxx11::
    list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::clear
              (&patlist);
    if (perfectmatch.
        super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
        ._M_impl._M_node._M_size == 0) {
      TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)this,(TPZRefPattern *)0x0);
    }
    else {
      this_01 = &perfectmatch;
      if (perfectmatch.
          super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
          ._M_impl._M_node._M_size != 1) {
        iVar4 = 0x1e;
        this_01 = &patlist;
        p_Var8 = (_List_node_base *)&perfectmatch;
        while (p_Var8 = (((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                           *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var8 != (_List_node_base *)&perfectmatch) {
          refpat.fRef = (TPZReference *)p_Var8[1]._M_next;
          LOCK();
          ((refpat.fRef)->fCounter).super___atomic_base<int>._M_i =
               ((refpat.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          iVar2 = TPZRefPattern::NSubElements((refpat.fRef)->fPointer);
          if (iVar2 < iVar4) {
            iVar4 = TPZRefPattern::NSubElements((refpat.fRef)->fPointer);
            std::__cxx11::
            list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
            clear(this_01);
            std::__cxx11::
            list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
            push_back(this_01,(value_type *)(p_Var8 + 1));
          }
          else {
            iVar2 = TPZRefPattern::NSubElements((refpat.fRef)->fPointer);
            if (iVar2 == iVar4) {
              std::__cxx11::
              list<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
              push_back(this_01,(value_type *)(p_Var8 + 1));
            }
          }
          TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&refpat);
        }
        if (patlist.
            super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
            ._M_impl._M_node._M_size != 1) {
          p_Var8 = (_List_node_base *)&patlist;
          while (p_Var8 = (((_List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
                             *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
                p_Var8 != (_List_node_base *)&patlist) {
            TPZGeoMesh::Print((TPZGeoMesh *)(*(long *)p_Var8[1]._M_next + 0xb0),
                              (ostream *)&std::cout);
          }
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Refine/TPZRefPatternTools.cpp"
                     ,0xf8);
        }
      }
      p_Var8 = (this_01->
               super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
               )._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      *(_List_node_base **)this = p_Var8;
      LOCK();
      pp_Var1 = &p_Var8->_M_prev;
      *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
      UNLOCK();
    }
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear(&perfectmatch.
              super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
            );
    std::__cxx11::
    _List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>::
    _M_clear(&patlist.
              super__List_base<TPZAutoPointer<TPZRefPattern>,_std::allocator<TPZAutoPointer<TPZRefPattern>_>_>
            );
  }
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZRefPatternTools::PerfectMatchRefPattern(TPZGeoEl *gel,
                                                                         TPZVec<int> &sidestorefine)
{
	if(!gel)
	{
		return NULL;
	}
	
	std::list<TPZAutoPointer<TPZRefPattern> > patlist, perfectmatch;
	TPZRefPatternTools::GetCompatibleRefPatterns(gel, patlist);
	
    // totototo
    //std::cout << "gel index " << gel->Index() << " sides " <<  sidestorefine << std::endl;
	std::list<TPZAutoPointer<TPZRefPattern> >::iterator it;
	for(it = patlist.begin(); it != patlist.end(); it++)
	{
		if( !(*it) )
		{
			continue;	
		}
		TPZGeoEl * gelTemp = (*it)->Element(0);
		int ncorners = gelTemp->NCornerNodes();
		int nsides = gelTemp->NSides();
		if(gelTemp->Dimension() == 3)
		{
			nsides--;
		}

		int is;
		for(is = ncorners; is < nsides; is++)
		{
			if( sidestorefine[is] != (*it)->NSideNodes(is) )
			{
				break;	
			}
		}
		if(is == nsides)
		{
            perfectmatch.push_back(*it);
		}
	}
    //std::cout << "perfect match size " << perfectmatch.size() << std::endl;
    
    patlist.clear();
    if (perfectmatch.size() == 1) {
        return *perfectmatch.begin();
    } else if(perfectmatch.size() > 1)
    {
        // return the refpattern with the least number of elements
        
        int minsubel = 30;
        for (auto it=perfectmatch.begin(); it!= perfectmatch.end(); it++) {
            TPZAutoPointer<TPZRefPattern> refpat = *it;
            if (refpat->NSubElements() < minsubel) {
                minsubel = refpat->NSubElements();
                patlist.clear();
                patlist.push_back(*it);
            }
            else if(refpat->NSubElements() == minsubel)
            {
                patlist.push_back(*it);
            }
        }
        if (patlist.size() != 1) {
            for (auto it2=patlist.begin(); it2 != patlist.end(); it2++) {
                (*it2)->fRefPatternMesh.Print();
            }
            DebugStop();
        }
        return *patlist.begin();
    }
    else
    {
        return NULL;
    }
}